

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

Token slang::parsing::Token::createMissing
                (BumpAllocator *alloc,TokenKind kind,SourceLocation location)

{
  string_view rawText;
  string_view rawText_00;
  string_view rawText_01;
  string_view rawText_02;
  string_view rawText_03;
  string_view rawText_04;
  string_view rawText_05;
  string_view rawText_06;
  string_view strText;
  Token TVar1;
  ulong uVar2;
  TokenKind kind_00;
  BumpAllocator *alloc_00;
  basic_string_view<char,_std::char_traits<char>_> local_210;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_200;
  Token local_1f0;
  TimeUnit local_1db;
  optional<slang::TimeUnit> local_1da;
  SourceLocation local_1d8;
  basic_string_view<char,_std::char_traits<char>_> local_1d0;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_1c0;
  Token local_1b0;
  optional<slang::TimeUnit> local_19a;
  SourceLocation local_198;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_180;
  Token local_170;
  undefined1 local_159;
  BumpAllocator *local_158;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_140;
  Token local_130;
  BumpAllocator *local_120;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_108;
  Token local_f8;
  BumpAllocator *local_e8;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_d0;
  Token local_c0;
  BumpAllocator *local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_98;
  Token local_88;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  SourceLocation local_68;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> local_50;
  Token local_40;
  TokenKind local_2a;
  BumpAllocator *pBStack_28;
  TokenKind kind_local;
  BumpAllocator *alloc_local;
  SourceLocation location_local;
  Token result;
  
  local_2a = kind;
  pBStack_28 = alloc;
  alloc_local = (BumpAllocator *)location;
  Token((Token *)&location_local);
  alloc_00 = pBStack_28;
  kind_00 = local_2a;
  if (local_2a == StringLiteral) {
LAB_00257abd:
    nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span<true,_0>
              (&local_50);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"");
    local_68 = (SourceLocation)alloc_local;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"");
    rawText._M_str = local_60._M_str;
    rawText._M_len = local_60._M_len;
    strText._M_str._0_1_ = (char)local_78._M_str;
    strText._M_len = local_78._M_len;
    strText._M_str._1_1_ = (char)((ulong)local_78._M_str >> 8);
    strText._M_str._2_2_ = (short)((ulong)local_78._M_str >> 0x10);
    strText._M_str._4_4_ = (int)((ulong)local_78._M_str >> 0x20);
    Token(&local_40,alloc_00,kind_00,local_50,rawText,local_68,strText);
    location_local._0_2_ = local_40.kind;
    location_local._2_1_ = local_40._2_1_;
    location_local._3_5_ = local_40._3_5_;
    result._0_8_ = local_40.info;
  }
  else {
    if (local_2a == IntegerLiteral) {
      nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span<true,_0>
                (&local_d0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e0,"");
      local_e8 = alloc_local;
      rawText_01._M_str = local_e0._M_str;
      rawText_01._M_len = local_e0._M_len;
      Token(&local_c0,alloc_00,IntegerLiteral,local_d0,rawText_01,(SourceLocation)alloc_local,
            (SVInt *)SVInt::Zero);
      location_local._0_2_ = local_c0.kind;
      location_local._2_1_ = local_c0._2_1_;
      location_local._3_5_ = local_c0._3_5_;
      result._0_8_ = local_c0.info;
      goto LAB_00258072;
    }
    if (local_2a == IntegerBase) {
      nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span<true,_0>
                (&local_108);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_118,"");
      local_120 = alloc_local;
      rawText_02._M_str = local_118._M_str;
      rawText_02._M_len = local_118._M_len;
      Token(&local_f8,alloc_00,IntegerBase,local_108,rawText_02,(SourceLocation)alloc_local,Decimal,
            false);
      location_local._0_2_ = local_f8.kind;
      location_local._2_1_ = local_f8._2_1_;
      location_local._3_5_ = local_f8._3_5_;
      result._0_8_ = local_f8.info;
      goto LAB_00258072;
    }
    if (local_2a == UnbasedUnsizedLiteral) {
      nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span<true,_0>
                (&local_140);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_150,"");
      local_158 = alloc_local;
      local_159 = 0x80;
      rawText_03._M_str = local_150._M_str;
      rawText_03._M_len = local_150._M_len;
      Token(&local_130,alloc_00,UnbasedUnsizedLiteral,local_140,rawText_03,
            (SourceLocation)alloc_local,(logic_t)0x80);
      location_local._0_2_ = local_130.kind;
      location_local._2_1_ = local_130._2_1_;
      location_local._3_5_ = local_130._3_5_;
      result._0_8_ = local_130.info;
      goto LAB_00258072;
    }
    if (local_2a == RealLiteral) {
      nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span<true,_0>
                (&local_180);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_190,"");
      local_198 = (SourceLocation)alloc_local;
      std::optional<slang::TimeUnit>::optional(&local_19a);
      rawText_04._M_str = local_190._M_str;
      rawText_04._M_len = local_190._M_len;
      Token(&local_170,alloc_00,RealLiteral,local_180,rawText_04,local_198,0.0,false,local_19a);
      location_local._0_2_ = local_170.kind;
      location_local._2_1_ = local_170._2_1_;
      location_local._3_5_ = local_170._3_5_;
      result._0_8_ = local_170.info;
      goto LAB_00258072;
    }
    if (local_2a == TimeLiteral) {
      nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span<true,_0>
                (&local_1c0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d0,"");
      local_1d8 = (SourceLocation)alloc_local;
      local_1db = Seconds;
      std::optional<slang::TimeUnit>::optional<slang::TimeUnit,_true>(&local_1da,&local_1db);
      rawText_05._M_str = local_1d0._M_str;
      rawText_05._M_len = local_1d0._M_len;
      Token(&local_1b0,alloc_00,TimeLiteral,local_1c0,rawText_05,local_1d8,0.0,false,local_1da);
      location_local._0_2_ = local_1b0.kind;
      location_local._2_1_ = local_1b0._2_1_;
      location_local._3_5_ = local_1b0._3_5_;
      result._0_8_ = local_1b0.info;
      goto LAB_00258072;
    }
    if (local_2a != Directive) {
      if (local_2a == IncludeFileName) goto LAB_00257abd;
      if (local_2a != MacroUsage) {
        nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span<true,_0>
                  (&local_200);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_210,"");
        rawText_06._M_str = local_210._M_str;
        rawText_06._M_len = local_210._M_len;
        Token(&local_1f0,alloc_00,kind_00,local_200,rawText_06,(SourceLocation)alloc_local);
        location_local._0_2_ = local_1f0.kind;
        location_local._2_1_ = local_1f0._2_1_;
        location_local._3_5_ = local_1f0._3_5_;
        result._0_8_ = local_1f0.info;
        goto LAB_00258072;
      }
    }
    nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::span<true,_0>
              (&local_98);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"");
    local_b0 = alloc_local;
    rawText_00._M_str = local_a8._M_str;
    rawText_00._M_len = local_a8._M_len;
    Token(&local_88,alloc_00,kind_00,local_98,rawText_00,(SourceLocation)alloc_local,Unknown);
    location_local._0_2_ = local_88.kind;
    location_local._2_1_ = local_88._2_1_;
    location_local._3_5_ = local_88._3_5_;
    result._0_8_ = local_88.info;
  }
LAB_00258072:
  uVar2 = CONCAT53(location_local._3_5_,CONCAT12(location_local._2_1_,location_local._0_2_)) |
          0x10000;
  TVar1.info = (Info *)result._0_8_;
  TVar1.kind = (short)uVar2;
  TVar1._2_1_ = (char)(uVar2 >> 0x10);
  TVar1.numFlags.raw = (char)(uVar2 >> 0x18);
  TVar1.rawLen = (int)(uVar2 >> 0x20);
  return TVar1;
}

Assistant:

Token Token::createMissing(BumpAllocator& alloc, TokenKind kind, SourceLocation location) {
    Token result;
    switch (kind) {
        case TokenKind::IncludeFileName:
        case TokenKind::StringLiteral:
            result = Token(alloc, kind, {}, "", location, "");
            break;
        case TokenKind::Directive:
        case TokenKind::MacroUsage:
            result = Token(alloc, kind, {}, "", location, SyntaxKind::Unknown);
            break;
        case TokenKind::IntegerLiteral:
            result = Token(alloc, kind, {}, "", location, SVInt::Zero);
            break;
        case TokenKind::IntegerBase:
            result = Token(alloc, kind, {}, "", location, LiteralBase::Decimal, false);
            break;
        case TokenKind::UnbasedUnsizedLiteral:
            result = Token(alloc, kind, {}, "", location, logic_t::x);
            break;
        case TokenKind::RealLiteral:
            result = Token(alloc, kind, {}, "", location, 0.0, false, std::nullopt);
            break;
        case TokenKind::TimeLiteral:
            result = Token(alloc, kind, {}, "", location, 0.0, false, TimeUnit::Seconds);
            break;
        default:
            result = Token(alloc, kind, {}, "", location);
            break;
    }

    result.missing = true;
    return result;
}